

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

int uv_inet_pton(int af,char *src,void *dst)

{
  int in_EDI;
  uchar *unaff_retaddr;
  char *in_stack_00000008;
  uchar *in_stack_00000030;
  char *in_stack_00000038;
  undefined4 local_4;
  
  if (in_EDI == 2) {
    local_4 = inet_pton4(in_stack_00000008,unaff_retaddr);
  }
  else if (in_EDI == 10) {
    local_4 = inet_pton6(in_stack_00000038,in_stack_00000030);
  }
  else {
    local_4 = -0x61;
  }
  return local_4;
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6:
    return (inet_pton6(src, dst));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}